

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowStackToolWindow(bool *p_open)

{
  char *pcVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  _func_void_void_ptr_char_ptr *p_Var4;
  ImGuiStackLevelInfo *pIVar5;
  ImVec2 IVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ImGuiContext *pIVar9;
  ImGuiContext *pIVar10;
  bool bVar11;
  ImU32 color;
  long lVar12;
  char cVar13;
  bool *pbVar14;
  char *pcVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  ImGuiContext *g;
  ulong uVar19;
  long lVar20;
  float fVar21;
  char level_desc [256];
  ImVec4 local_138 [16];
  
  pIVar9 = GImGui;
  uVar2 = (GImGui->NextWindowData).Flags;
  if ((uVar2 & 2) == 0) {
    fVar21 = GImGui->FontSize;
    (GImGui->NextWindowData).Flags = uVar2 | 2;
    (pIVar9->NextWindowData).SizeVal.x = 0.0;
    (pIVar9->NextWindowData).SizeVal.y = fVar21 * 8.0;
    (pIVar9->NextWindowData).SizeCond = 4;
  }
  bVar11 = Begin("Dear ImGui Stack Tool",p_open,0);
  if ((bVar11) &&
     (pIVar3 = GImGui->CurrentWindow, pIVar3->WriteAccessed = true, pIVar3->BeginCount < 2)) {
    Text("HoveredId: 0x%08X, ActiveId:  0x%08X",(ulong)pIVar9->HoveredIdPreviousFrame,
         (ulong)pIVar9->ActiveId);
    pIVar10 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar10->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    MetricsHelpMarker(
                     "Hover an item with the mouse to display elements of the ID Stack leading to the item\'s final ID.\nEach level of the stack correspond to a PushID() call.\nAll levels of the stack are hashed together to make the final ID of a widget (ID displayed at the bottom level of the stack).\nRead FAQ entry about the ID stack for details."
                     );
    fVar21 = (float)pIVar9->Time - (pIVar9->DebugStackTool).CopyToClipboardLastTime;
    pbVar14 = &(pIVar9->DebugStackTool).CopyToClipboardOnCtrlC;
    Checkbox("Ctrl+C: copy path to clipboard",pbVar14);
    pIVar10 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar10->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    if (((fVar21 < 0.0) || (0.75 <= fVar21)) || (fVar21 = fmodf(fVar21,0.25), 0.125 <= fVar21)) {
      local_138[0].x = 0.0;
      local_138[0].y = 0.0;
      local_138[0].z = 0.0;
      local_138[0].w = 0.0;
    }
    else {
      local_138[0].x = 1.0;
      local_138[0].y = 1.0;
      local_138[0].z = 0.3;
      local_138[0].w = 1.0;
    }
    TextColored(local_138,"*COPIED*");
    if (((*pbVar14 == true) && ((GImGui->IO).KeysData[0x281].Down == true)) &&
       (bVar11 = IsKeyPressed(0x224,true), bVar11)) {
      (pIVar9->DebugStackTool).CopyToClipboardLastTime = (float)pIVar9->Time;
      pcVar1 = pIVar9->TempBuffer;
      pbVar14 = (bool *)pcVar1;
      if (0 < (pIVar9->DebugStackTool).Results.Size) {
        iVar16 = 0;
        lVar17 = 0x5658;
        do {
          *pbVar14 = true;
          StackToolFormatLevelInfo(&pIVar9->DebugStackTool,iVar16,false,(char *)local_138,0x100);
          lVar12 = lVar17 + 1;
          pcVar15 = (char *)((long)&local_138[0].x + 1);
          cVar13 = local_138[0].x._0_1_;
          if (local_138[0].x._0_1_ != '\0') {
            do {
              lVar20 = lVar12;
              if (cVar13 == '/') {
                (&pIVar9->Initialized)[lVar12] = true;
                lVar20 = lVar17 + 2;
              }
              (&pIVar9->Initialized)[lVar20] = (bool)cVar13;
              lVar12 = lVar20 + 1;
              cVar13 = *pcVar15;
            } while ((cVar13 != '\0') && (pcVar15 = pcVar15 + 1, lVar17 = lVar20, lVar20 < 0x6256));
          }
          iVar16 = iVar16 + 1;
          pbVar14 = &pIVar9->Initialized + lVar12;
        } while ((iVar16 < (pIVar9->DebugStackTool).Results.Size) &&
                (lVar17 = lVar12, lVar12 < 0x6256));
      }
      *pbVar14 = false;
      p_Var4 = (GImGui->IO).SetClipboardTextFn;
      if (p_Var4 != (_func_void_void_ptr_char_ptr *)0x0) {
        (*p_Var4)((GImGui->IO).ClipboardUserData,pcVar1);
      }
    }
    (pIVar9->DebugStackTool).LastActiveFrame = pIVar9->FrameCount;
    if (0 < (pIVar9->DebugStackTool).Results.Size) {
      local_138[0].x = 0.0;
      local_138[0].y = 0.0;
      bVar11 = BeginTable("##table",3,0x780,(ImVec2 *)local_138,0.0);
      if (bVar11) {
        IVar6 = ImFont::CalcTextSizeA
                          (GImGui->Font,GImGui->FontSize,3.4028235e+38,-1.0,"0xDDDDDDDD",(char *)0x0
                           ,(char **)0x0);
        fVar21 = (float)(int)(IVar6.x + 0.99999);
        TableSetupColumn("Seed",0x10,fVar21,0);
        TableSetupColumn("PushID",8,0.0,0);
        TableSetupColumn("Result",0x10,fVar21,0);
        TableHeadersRow();
        if (0 < (pIVar9->DebugStackTool).Results.Size) {
          lVar17 = 0;
          uVar19 = 0;
          do {
            pIVar5 = (pIVar9->DebugStackTool).Results.Data;
            TableNextColumn();
            uVar18 = 0;
            if (uVar19 != 0) {
              uVar18 = (ulong)*(uint *)((pIVar9->DebugStackTool).Results.Data[-1].Desc + lVar17 + -7
                                       );
            }
            Text("0x%08X",uVar18);
            TableNextColumn();
            StackToolFormatLevelInfo
                      (&pIVar9->DebugStackTool,(int)uVar19,true,pIVar9->TempBuffer,0xc01);
            TextUnformatted(pIVar9->TempBuffer,(char *)0x0);
            TableNextColumn();
            Text("0x%08X",(ulong)*(uint *)(pIVar5->Desc + lVar17 + -7));
            iVar16 = (pIVar9->DebugStackTool).Results.Size;
            if (uVar19 == iVar16 - 1) {
              local_138[0].x = (GImGui->Style).Colors[0x18].x;
              local_138[0].y = (GImGui->Style).Colors[0x18].y;
              uVar7 = (GImGui->Style).Colors[0x18].z;
              uVar8 = (GImGui->Style).Colors[0x18].w;
              local_138[0].w = (GImGui->Style).Alpha * (float)uVar8;
              local_138[0].z = (float)uVar7;
              color = ColorConvertFloat4ToU32(local_138);
              TableSetBgColor(3,color,-1);
              iVar16 = (pIVar9->DebugStackTool).Results.Size;
            }
            uVar19 = uVar19 + 1;
            lVar17 = lVar17 + 0x40;
          } while ((long)uVar19 < (long)iVar16);
        }
        EndTable();
      }
    }
    End();
    return;
  }
  End();
  return;
}

Assistant:

void ImGui::ShowStackToolWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    if (!(g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSize))
        SetNextWindowSize(ImVec2(0.0f, GetFontSize() * 8.0f), ImGuiCond_FirstUseEver);
    if (!Begin("Dear ImGui Stack Tool", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    // Display hovered/active status
    ImGuiStackTool* tool = &g.DebugStackTool;
    const ImGuiID hovered_id = g.HoveredIdPreviousFrame;
    const ImGuiID active_id = g.ActiveId;
#ifdef IMGUI_ENABLE_TEST_ENGINE
    Text("HoveredId: 0x%08X (\"%s\"), ActiveId:  0x%08X (\"%s\")", hovered_id, hovered_id ? ImGuiTestEngine_FindItemDebugLabel(&g, hovered_id) : "", active_id, active_id ? ImGuiTestEngine_FindItemDebugLabel(&g, active_id) : "");
#else
    Text("HoveredId: 0x%08X, ActiveId:  0x%08X", hovered_id, active_id);
#endif
    SameLine();
    MetricsHelpMarker("Hover an item with the mouse to display elements of the ID Stack leading to the item's final ID.\nEach level of the stack correspond to a PushID() call.\nAll levels of the stack are hashed together to make the final ID of a widget (ID displayed at the bottom level of the stack).\nRead FAQ entry about the ID stack for details.");

    // CTRL+C to copy path
    const float time_since_copy = (float)g.Time - tool->CopyToClipboardLastTime;
    Checkbox("Ctrl+C: copy path to clipboard", &tool->CopyToClipboardOnCtrlC);
    SameLine();
    TextColored((time_since_copy >= 0.0f && time_since_copy < 0.75f && ImFmod(time_since_copy, 0.25f) < 0.25f * 0.5f) ? ImVec4(1.f, 1.f, 0.3f, 1.f) : ImVec4(), "*COPIED*");
    if (tool->CopyToClipboardOnCtrlC && IsKeyDown(ImGuiKey_ModCtrl) && IsKeyPressed(ImGuiKey_C))
    {
        tool->CopyToClipboardLastTime = (float)g.Time;
        char* p = g.TempBuffer;
        char* p_end = p + IM_ARRAYSIZE(g.TempBuffer);
        for (int stack_n = 0; stack_n < tool->Results.Size && p + 3 < p_end; stack_n++)
        {
            *p++ = '/';
            char level_desc[256];
            StackToolFormatLevelInfo(tool, stack_n, false, level_desc, IM_ARRAYSIZE(level_desc));
            for (int n = 0; level_desc[n] && p + 2 < p_end; n++)
            {
                if (level_desc[n] == '/')
                    *p++ = '\\';
                *p++ = level_desc[n];
            }
        }
        *p = '\0';
        SetClipboardText(g.TempBuffer);
    }

    // Display decorated stack
    tool->LastActiveFrame = g.FrameCount;
    if (tool->Results.Size > 0 && BeginTable("##table", 3, ImGuiTableFlags_Borders))
    {
        const float id_width = CalcTextSize("0xDDDDDDDD").x;
        TableSetupColumn("Seed", ImGuiTableColumnFlags_WidthFixed, id_width);
        TableSetupColumn("PushID", ImGuiTableColumnFlags_WidthStretch);
        TableSetupColumn("Result", ImGuiTableColumnFlags_WidthFixed, id_width);
        TableHeadersRow();
        for (int n = 0; n < tool->Results.Size; n++)
        {
            ImGuiStackLevelInfo* info = &tool->Results[n];
            TableNextColumn();
            Text("0x%08X", (n > 0) ? tool->Results[n - 1].ID : 0);
            TableNextColumn();
            StackToolFormatLevelInfo(tool, n, true, g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer));
            TextUnformatted(g.TempBuffer);
            TableNextColumn();
            Text("0x%08X", info->ID);
            if (n == tool->Results.Size - 1)
                TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_Header));
        }
        EndTable();
    }
    End();
}